

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void do_sprite_load(uint16_t scanline,uint16_t dot,uint16_t base_sprite_address,uint8_t sprite_size)

{
  undefined6 in_register_00000032;
  
  if ((int)CONCAT62(in_register_00000032,dot) == 0x101) {
    secondary_OAM_addr = '\0';
  }
  sprite0_on_current_scanline = sprite0_on_next_scanline;
  (*(code *)(&DAT_0010eb1c + *(int *)(&DAT_0010eb1c + (ulong)do_sprite_load::cycle_count * 4)))();
  return;
}

Assistant:

void do_sprite_load(
    uint16_t scanline,
    uint16_t dot,
    uint16_t base_sprite_address,
    uint8_t sprite_size
) {
    static uint8_t cycle_count = 0;
    uint16_t const sprite_number = (dot - 257) / 8;
    static uint8_t sprite_y;
    static uint8_t sprite_index;
    static uint16_t low_sprite_address;
    static uint16_t high_sprite_address;
    static bool in_range;

    if(dot == 257)
        set_secondary_OAM_address(0);

    sprite0_on_current_scanline = sprite0_on_next_scanline;
    switch(cycle_count) {
        case 0:
            sprite_y = read_secondary_OAM();
            increment_secondary_OAM_address();
            break;
        case 1:
            sprite_index = read_secondary_OAM();
            increment_secondary_OAM_address();
            break;
        case 2:
            sprite_attributes[sprite_number] = read_secondary_OAM();
            increment_secondary_OAM_address();
            break;
        case 3:
            sprite_x[sprite_number] = read_secondary_OAM();
            increment_secondary_OAM_address();
            break;
        case 4:
            if(sprite_size == 8) {
                low_sprite_address = calc_8x8_low_sprite_tile_address(
                    scanline, 
                    base_sprite_address,
                    sprite_y,
                    sprite_index,
                    sprite_attributes[sprite_number],
                    &in_range
                );
            }
            else {
                low_sprite_address = calc_8x16_low_sprite_tile_address(
                    scanline, 
                    sprite_y,
                    sprite_index,
                    sprite_attributes[sprite_number]
                );
            }
            break;
        case 5:
            sprite_low_pattern[sprite_number] = in_range ? read_VRAM(low_sprite_address) : 0x00;
            if(should_flip_sprite_horizontal(sprite_attributes[sprite_number]))
                sprite_low_pattern[sprite_number] = rev_byte(sprite_low_pattern[sprite_number]);
            break;
        case 6:
            high_sprite_address = calc_high_sprite_tile_address(low_sprite_address);
            break;
        case 7:
            sprite_high_pattern[sprite_number] = in_range ? read_VRAM(high_sprite_address) : 0x00;
            if(should_flip_sprite_horizontal(sprite_attributes[sprite_number]))
                sprite_high_pattern[sprite_number] = rev_byte(sprite_high_pattern[sprite_number]);
            break;
    }

    cycle_count = (cycle_count + 1) & 0x7;
}